

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * __thiscall doctest::String::operator=(String *this,String *other)

{
  char *pcVar1;
  bool bVar2;
  String *other_local;
  String *this_local;
  
  if (this != other) {
    bVar2 = isOnStack(this);
    if ((!bVar2) && (pcVar1 = (this->field_0).data.ptr, pcVar1 != (char *)0x0)) {
      operator_delete__(pcVar1);
    }
    (this->field_0).data.ptr = (other->field_0).data.ptr;
    *(undefined8 *)((long)&this->field_0 + 8) = *(undefined8 *)((long)&other->field_0 + 8);
    *(undefined8 *)((long)&this->field_0 + 0x10) = *(undefined8 *)((long)&other->field_0 + 0x10);
    (other->field_0).buf[0] = '\0';
    setLast(other,0x17);
  }
  return this;
}

Assistant:

String& String::operator=(String&& other) {
    using namespace std;
    if(this != &other) {
        if(!isOnStack())
            delete[] data.ptr;
        memcpy(buf, other.buf, len);
        other.buf[0] = '\0';
        other.setLast();
    }
    return *this;
}